

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O0

void __thiscall FVoxelTexture::FVoxelTexture(FVoxelTexture *this,FVoxel *vox)

{
  FVoxel *vox_local;
  FVoxelTexture *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FVoxelTexture_00b68a10;
  this->SourceVox = vox;
  (this->super_FTexture).Width = 0x10;
  (this->super_FTexture).Height = 0x10;
  (this->super_FTexture).WidthBits = '\x04';
  (this->super_FTexture).HeightBits = '\x04';
  (this->super_FTexture).WidthMask = 0xf;
  this->Pixels = (BYTE *)0x0;
  *(ushort *)&(this->super_FTexture).gl_info.field_0x4c =
       *(ushort *)&(this->super_FTexture).gl_info.field_0x4c & 0xfeff | 0x100;
  *(ushort *)&(this->super_FTexture).gl_info.field_0x4c =
       *(ushort *)&(this->super_FTexture).gl_info.field_0x4c & 0xfdff | 0x200;
  return;
}

Assistant:

FVoxelTexture::FVoxelTexture(FVoxel *vox)
{
	SourceVox = vox;
	Width = 16;
	Height = 16;
	WidthBits = 4;
	HeightBits = 4;
	WidthMask = 15;
	Pixels = NULL;
	gl_info.bNoFilter = true;
	gl_info.bNoCompress = true;
}